

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void RangeDec_Decode(CPpmd8 *p,UInt32 start,UInt32 size)

{
  UInt32 UVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  UInt32 size_local;
  UInt32 start_local;
  CPpmd8 *p_local;
  
  iVar3 = p->Range * start;
  p->Low = iVar3 + p->Low;
  p->Code = p->Code - iVar3;
  p->Range = size * p->Range;
  while( true ) {
    bVar4 = true;
    if ((0xffffff < (p->Low ^ p->Low + p->Range)) && (bVar4 = p->Range < 0x8000, bVar4)) {
      p->Range = -p->Low & 0x7fff;
    }
    if (!bVar4) break;
    UVar1 = p->Code;
    bVar2 = (*((p->Stream).In)->Read)((p->Stream).In);
    p->Code = UVar1 << 8 | (uint)bVar2;
    p->Range = p->Range << 8;
    p->Low = p->Low << 8;
  }
  return;
}

Assistant:

static void RangeDec_Decode(CPpmd8 *p, UInt32 start, UInt32 size)
{
  start *= p->Range;
  p->Low += start;
  p->Code -= start;
  p->Range *= size;

  while ((p->Low ^ (p->Low + p->Range)) < kTop ||
      (p->Range < kBot && ((p->Range = (0 - p->Low) & (kBot - 1)), 1)))
  {
    p->Code = (p->Code << 8) | p->Stream.In->Read(p->Stream.In);
    p->Range <<= 8;
    p->Low <<= 8;
  }
}